

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

FMFormat_conflict expand_format_from_rep(format_rep rep)

{
  uint16_t uVar1;
  uint uVar2;
  uint uVar3;
  FMFormat_conflict p_Var4;
  FMFormat_conflict *pp_Var5;
  FMStructDescList p_Var6;
  FMFormat_conflict p_Var7;
  format_rep in_RDI;
  uint last_subrep_size;
  _subformat_wire_format *subrep;
  int i;
  FMStructDescList master_struct_list;
  FMFormat_conflict *subformats;
  FMFormat_conflict top_format;
  int format_count;
  _subformat_wire_format *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  format_rep local_38;
  int local_2c;
  
  local_38 = in_RDI + 1;
  uVar2 = (uint)in_RDI->subformat_count;
  p_Var4 = expand_subformat_from_rep(in_stack_ffffffffffffffb8);
  pp_Var5 = (FMFormat_conflict *)
            ffs_malloc(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  p_Var6 = (FMStructDescList)
           ffs_malloc(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (local_2c = 0; local_2c < (int)uVar2; local_2c = local_2c + 1) {
    uVar1 = ntohs(local_38->format_rep_length);
    uVar3 = (uint)uVar1;
    if (local_38->record_byte_order != '\0') {
      uVar1 = ntohs(local_38[3].format_rep_length);
      uVar3 = (uint)uVar1 * 0x10000 + uVar3;
    }
    local_38 = (format_rep)((long)&local_38->format_rep_length + (ulong)uVar3);
    p_Var7 = expand_subformat_from_rep(in_stack_ffffffffffffffb8);
    pp_Var5[local_2c] = p_Var7;
    p_Var6[local_2c + 1].format_name = pp_Var5[local_2c]->format_name;
    p_Var6[local_2c + 1].field_list = pp_Var5[local_2c]->field_list;
    p_Var6[local_2c + 1].struct_size = pp_Var5[local_2c]->record_length;
    p_Var6[local_2c + 1].opt_info = (FMOptInfo *)0x0;
  }
  pp_Var5[(int)uVar2] = (FMFormat_conflict)0x0;
  p_Var6[(int)(uVar2 + 1)].format_name = (char *)0x0;
  p_Var6[(int)(uVar2 + 1)].field_list = (FMFieldList)0x0;
  p_Var6[(int)(uVar2 + 1)].struct_size = 0;
  p_Var6[(int)(uVar2 + 1)].opt_info = (FMOptInfo *)0x0;
  p_Var6->format_name = p_Var4->format_name;
  p_Var6->field_list = p_Var4->field_list;
  p_Var6->struct_size = p_Var4->record_length;
  p_Var6->opt_info = (FMOptInfo *)0x0;
  p_Var4->subformats = pp_Var5;
  p_Var4->server_format_rep = in_RDI;
  p_Var4->master_struct_list = p_Var6;
  return p_Var4;
}

Assistant:

extern FMFormat
expand_format_from_rep(format_rep rep)
{
    int format_count;
    FMFormat top_format;
    FMFormat *subformats;
    FMStructDescList master_struct_list;
    int i;

    struct _subformat_wire_format *subrep = (struct _subformat_wire_format*)
	(((char*)rep ) + sizeof(struct _format_wire_format_1));
    format_count = rep->subformat_count;
    top_format = expand_subformat_from_rep(subrep);
    subformats = malloc(sizeof(subformats[0]) * (format_count + 1));
    master_struct_list = malloc(sizeof(master_struct_list[0]) * (format_count+2));
    for (i = 0; i < format_count; i++) {
	UINT4 last_subrep_size = ntohs(subrep->f.f1.subformat_rep_length);
	if (subrep->f.f1.server_rep_version > 0) {
	    last_subrep_size += (ntohs(subrep->f.f1.top_bytes_subformat_rep_length) << 16);
	}
	subrep = (struct _subformat_wire_format*)(((char*)subrep) + last_subrep_size);
	subformats[i] = expand_subformat_from_rep(subrep);
	master_struct_list[i+1].format_name = subformats[i]->format_name;
	master_struct_list[i+1].field_list = subformats[i]->field_list;
	master_struct_list[i+1].struct_size = subformats[i]->record_length;
	master_struct_list[i+1].opt_info = NULL;
    }
    subformats[format_count] = NULL;
    master_struct_list[format_count+1].format_name = NULL;
    master_struct_list[format_count+1].field_list = NULL;
    master_struct_list[format_count+1].struct_size = 0;
    master_struct_list[format_count+1].opt_info = NULL;
    master_struct_list[0].format_name = top_format->format_name;
    master_struct_list[0].field_list = top_format->field_list;
    master_struct_list[0].struct_size = top_format->record_length;
    master_struct_list[0].opt_info = NULL;
    top_format->subformats = subformats;
    top_format->server_format_rep = rep;
    top_format->master_struct_list = master_struct_list;
    return top_format;
}